

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void GradientPredictInverse_SSE2(uint8_t *in,uint8_t *top,uint8_t *row,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong uVar4;
  int delta;
  __m128i tmp5;
  __m128i tmp4;
  __m128i tmp3;
  int k;
  __m128i mask_hi;
  __m128i out;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i tmp1;
  __m128i tmp0;
  __m128i A;
  __m128i zero;
  int max_pos;
  int i;
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined1 local_248 [16];
  undefined4 local_218;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  
  if (0 < (int)in_ECX) {
    local_248 = ZEXT116(*(byte *)(in_RDX + -1));
    for (local_218 = 0; local_218 < (int)(in_ECX & 0xfffffff8); local_218 = local_218 + 8) {
      uVar1 = *(undefined8 *)(in_RSI + local_218);
      uVar2 = *(undefined8 *)(in_RSI + (local_218 + -1));
      local_b8 = (byte)uVar1;
      uStack_b7 = (byte)((ulong)uVar1 >> 8);
      uStack_b6 = (byte)((ulong)uVar1 >> 0x10);
      uStack_b5 = (byte)((ulong)uVar1 >> 0x18);
      uStack_b4 = (byte)((ulong)uVar1 >> 0x20);
      uStack_b3 = (byte)((ulong)uVar1 >> 0x28);
      uStack_b2 = (byte)((ulong)uVar1 >> 0x30);
      uStack_b1 = (byte)((ulong)uVar1 >> 0x38);
      local_d8 = (byte)uVar2;
      uStack_d7 = (byte)((ulong)uVar2 >> 8);
      uStack_d6 = (byte)((ulong)uVar2 >> 0x10);
      uStack_d5 = (byte)((ulong)uVar2 >> 0x18);
      uStack_d4 = (byte)((ulong)uVar2 >> 0x20);
      uStack_d3 = (byte)((ulong)uVar2 >> 0x28);
      uStack_d2 = (byte)((ulong)uVar2 >> 0x30);
      uStack_d1 = (byte)((ulong)uVar2 >> 0x38);
      uVar1 = *(undefined8 *)(in_RDI + local_218);
      uStack_96 = (ushort)uStack_b7;
      uStack_94 = (ushort)uStack_b6;
      uStack_92 = (ushort)uStack_b5;
      uStack_8e = (ushort)uStack_b3;
      uStack_8c = (ushort)uStack_b2;
      uStack_8a = (ushort)uStack_b1;
      uStack_a6 = (ushort)uStack_d7;
      uStack_a4 = (ushort)uStack_d6;
      uStack_a2 = (ushort)uStack_d5;
      uStack_9e = (ushort)uStack_d3;
      uStack_9c = (ushort)uStack_d2;
      uStack_9a = (ushort)uStack_d1;
      local_2b8 = 0;
      local_2c8 = 0xff;
      local_2cc = 8;
      while( true ) {
        local_78 = local_248._0_2_;
        uStack_76 = local_248._2_2_;
        uStack_74 = local_248._4_2_;
        uStack_72 = local_248._6_2_;
        uStack_70 = local_248._8_2_;
        uStack_6e = local_248._10_2_;
        uStack_6c = local_248._12_2_;
        uStack_6a = local_248._14_2_;
        local_78 = local_78 + ((ushort)local_b8 - (ushort)local_d8);
        uStack_76 = uStack_76 + (uStack_96 - uStack_a6);
        uStack_74 = uStack_74 + (uStack_94 - uStack_a4);
        uStack_72 = uStack_72 + (uStack_92 - uStack_a2);
        uStack_70 = uStack_70 + ((ushort)uStack_b4 - (ushort)uStack_d4);
        uStack_6e = uStack_6e + (uStack_8e - uStack_9e);
        uStack_6c = uStack_6c + (uStack_8c - uStack_9c);
        uStack_6a = uStack_6a + (uStack_8a - uStack_9a);
        local_158 = (char)uVar1;
        uStack_157 = (char)((ulong)uVar1 >> 8);
        uStack_156 = (char)((ulong)uVar1 >> 0x10);
        uStack_155 = (char)((ulong)uVar1 >> 0x18);
        uStack_154 = (char)((ulong)uVar1 >> 0x20);
        uStack_153 = (char)((ulong)uVar1 >> 0x28);
        uStack_152 = (char)((ulong)uVar1 >> 0x30);
        uStack_151 = (char)((ulong)uVar1 >> 0x38);
        uVar4 = CONCAT17(((0 < uStack_6a) * (uStack_6a < 0x100) * (char)uStack_6a -
                         (0xff < uStack_6a)) + uStack_151,
                         CONCAT16(((0 < uStack_6c) * (uStack_6c < 0x100) * (char)uStack_6c -
                                  (0xff < uStack_6c)) + uStack_152,
                                  CONCAT15(((0 < uStack_6e) * (uStack_6e < 0x100) * (char)uStack_6e
                                           - (0xff < uStack_6e)) + uStack_153,
                                           CONCAT14(((0 < uStack_70) * (uStack_70 < 0x100) *
                                                     (char)uStack_70 - (0xff < uStack_70)) +
                                                    uStack_154,
                                                    CONCAT13(((0 < uStack_72) * (uStack_72 < 0x100)
                                                              * (char)uStack_72 - (0xff < uStack_72)
                                                             ) + uStack_155,
                                                             CONCAT12(((0 < uStack_74) *
                                                                       (uStack_74 < 0x100) *
                                                                       (char)uStack_74 -
                                                                      (0xff < uStack_74)) +
                                                                      uStack_156,
                                                                      CONCAT11(((0 < uStack_76) *
                                                                                (uStack_76 < 0x100)
                                                                                * (char)uStack_76 -
                                                                               (0xff < uStack_76)) +
                                                                               uStack_157,
                                                                               ((0 < local_78) *
                                                                                (local_78 < 0x100) *
                                                                                (char)local_78 -
                                                                               (0xff < local_78)) +
                                                                               local_158))))))) &
                local_2c8;
        local_2b8 = local_2b8 | uVar4;
        local_2cc = local_2cc + -1;
        if (local_2cc == 0) break;
        local_2c8 = local_2c8 << 8;
        uStack_f7 = (byte)uVar4;
        uStack_f6 = (undefined1)(uVar4 >> 8);
        uStack_f5 = (undefined1)(uVar4 >> 0x10);
        uStack_f4 = (undefined1)(uVar4 >> 0x18);
        uStack_f3 = (undefined1)(uVar4 >> 0x20);
        uStack_f2 = (undefined1)(uVar4 >> 0x28);
        uStack_f1 = (undefined1)(uVar4 >> 0x30);
        local_248._0_4_ = (uint)uStack_f7 << 0x10;
        local_248[4] = uStack_f6;
        local_248[5] = 0;
        local_248[6] = uStack_f5;
        local_248[7] = 0;
        local_248[8] = uStack_f4;
        local_248[9] = 0;
        local_248[10] = uStack_f3;
        local_248[0xb] = 0;
        local_248[0xc] = uStack_f2;
        local_248[0xd] = 0;
        local_248[0xe] = uStack_f1;
        local_248[0xf] = 0;
      }
      local_248._8_8_ = 0;
      local_248._0_8_ = uVar4 >> 0x38;
      *(ulong *)(in_RDX + local_218) = local_2b8;
    }
    for (; local_218 < (int)in_ECX; local_218 = local_218 + 1) {
      iVar3 = GradientPredictor_SSE2
                        (*(uint8_t *)(in_RDX + (local_218 + -1)),*(uint8_t *)(in_RSI + local_218),
                         *(uint8_t *)(in_RSI + (local_218 + -1)));
      *(char *)(in_RDX + local_218) = *(char *)(in_RDI + local_218) + (char)iVar3;
    }
  }
  return;
}

Assistant:

static void GradientPredictInverse_SSE2(const uint8_t* const in,
                                        const uint8_t* const top,
                                        uint8_t* const row, int length) {
  if (length > 0) {
    int i;
    const int max_pos = length & ~7;
    const __m128i zero = _mm_setzero_si128();
    __m128i A = _mm_set_epi32(0, 0, 0, row[-1]);   // left sample
    for (i = 0; i < max_pos; i += 8) {
      const __m128i tmp0 = _mm_loadl_epi64((const __m128i*)&top[i]);
      const __m128i tmp1 = _mm_loadl_epi64((const __m128i*)&top[i - 1]);
      const __m128i B = _mm_unpacklo_epi8(tmp0, zero);
      const __m128i C = _mm_unpacklo_epi8(tmp1, zero);
      const __m128i D = _mm_loadl_epi64((const __m128i*)&in[i]);  // base input
      const __m128i E = _mm_sub_epi16(B, C);  // unclipped gradient basis B - C
      __m128i out = zero;                     // accumulator for output
      __m128i mask_hi = _mm_set_epi32(0, 0, 0, 0xff);
      int k = 8;
      while (1) {
        const __m128i tmp3 = _mm_add_epi16(A, E);           // delta = A + B - C
        const __m128i tmp4 = _mm_packus_epi16(tmp3, zero);  // saturate delta
        const __m128i tmp5 = _mm_add_epi8(tmp4, D);         // add to in[]
        A = _mm_and_si128(tmp5, mask_hi);                   // 1-complement clip
        out = _mm_or_si128(out, A);                         // accumulate output
        if (--k == 0) break;
        A = _mm_slli_si128(A, 1);                        // rotate left sample
        mask_hi = _mm_slli_si128(mask_hi, 1);            // rotate mask
        A = _mm_unpacklo_epi8(A, zero);                  // convert 8b->16b
      }
      A = _mm_srli_si128(A, 7);       // prepare left sample for next iteration
      _mm_storel_epi64((__m128i*)&row[i], out);
    }
    for (; i < length; ++i) {
      const int delta = GradientPredictor_SSE2(row[i - 1], top[i], top[i - 1]);
      row[i] = (uint8_t)(in[i] + delta);
    }
  }
}